

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O3

void send_custom_headers(TadsServerThread *t,vm_val_t *headers)

{
  uint uVar1;
  ushort *puVar2;
  ssize_t sVar3;
  size_t in_RCX;
  uint uVar4;
  int in_R8D;
  bool bVar5;
  vm_val_t ele;
  vm_val_t local_50;
  vm_val_t local_40;
  
  uVar1 = vm_val_t::ll_length(headers);
  if (0 < (int)uVar1) {
    uVar4 = 1;
    do {
      local_50.typ = VM_INT;
      local_50.val.obj = uVar4;
      vm_val_t::ll_index(headers,&local_40,&local_50);
      puVar2 = (ushort *)vm_val_t::get_as_string(&local_40);
      if (puVar2 == (ushort *)0x0) {
        err_throw(0x7e3);
      }
      sVar3 = TadsServerThread::send(t,(int)puVar2 + 2,(void *)(ulong)*puVar2,in_RCX,in_R8D);
      if ((int)sVar3 == 0) {
LAB_00204860:
        throw_net_err("HTTPRequest: error sending headers",(t->socket->super_OS_CoreSocket).err);
      }
      else {
        sVar3 = TadsServerThread::send(t,0x2c7dc9,(void *)0x2,in_RCX,in_R8D);
        if ((int)sVar3 == 0) goto LAB_00204860;
      }
      in_RCX = (size_t)(uVar4 + 1);
      bVar5 = uVar4 != uVar1;
      uVar4 = uVar4 + 1;
    } while (bVar5);
  }
  return;
}

Assistant:

static void send_custom_headers(VMG_ TadsServerThread *t,
                                const vm_val_t *headers)
{
    /* send each header */
    int cnt = headers->ll_length(vmg0_);
    for (int i = 1 ; i <= cnt ; ++i)
    {
        /* get this list element */
        vm_val_t ele;
        headers->ll_index(vmg_ &ele, i);

        /* it has to be a string */
        const char *h = ele.get_as_string(vmg0_);
        if (h == 0)
            err_throw(VMERR_STRING_VAL_REQD);

        /* send the header string and the CR-LF */
        if (!t->send(h + VMB_LEN, vmb_get_len(h)) || !t->send("\r\n"))
            throw_net_err(vmg_ "HTTPRequest: error sending headers",
                          t->last_error());
    }
}